

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipart_parser.h
# Opt level: O3

file * __thiscall cppcms::impl::multipart_parser::get_file(multipart_parser *this)

{
  logic_error *this_00;
  string local_40;
  
  if (this->file_is_ready_ != false) {
    return (this->file_).super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Invalid state for get_file","");
  booster::logic_error::logic_error(this_00,&local_40);
  __cxa_throw(this_00,&booster::logic_error::typeinfo,booster::logic_error::~logic_error);
}

Assistant:

http::file &get_file()
			{
				if(!file_is_ready_)
					throw booster::logic_error("Invalid state for get_file");
				return *file_;
			}